

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  ulong uVar1;
  uint uVar2;
  char *__assertion;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *puVar7;
  bool bVar8;
  
  son[cyclic_pos] = cur_match;
  do {
    do {
      do {
        bVar8 = depth == 0;
        depth = depth - 1;
        if ((bVar8) || (uVar2 = pos - cur_match, cyclic_size <= uVar2)) {
          return matches;
        }
        puVar7 = cur + -(ulong)uVar2;
        uVar3 = 0;
        if (cyclic_pos < uVar2) {
          uVar3 = cyclic_size;
        }
        cur_match = son[(cyclic_pos - uVar2) + uVar3];
      } while ((puVar7[len_best] != cur[len_best]) || (*puVar7 != *cur));
      if (len_limit == 0) {
        __assertion = "len <= limit";
        uVar2 = 0x2e;
LAB_0019eced:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,uVar2,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if ((int)len_limit < 0) {
        __assertion = "limit <= UINT32_MAX / 2";
        uVar2 = 0x2f;
        goto LAB_0019eced;
      }
      uVar4 = 1;
      while( true ) {
        uVar6 = len_limit;
        if (len_limit <= uVar4) goto LAB_0019ec90;
        uVar5 = *(long *)(puVar7 + uVar4) - *(long *)(cur + uVar4);
        if (uVar5 != 0) break;
        uVar4 = uVar4 + 8;
      }
      uVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      uVar6 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar4;
      if (len_limit <= uVar6) {
        uVar6 = len_limit;
      }
LAB_0019ec90:
    } while (uVar6 <= len_best);
    matches->len = uVar6;
    matches->dist = uVar2 - 1;
    matches = matches + 1;
    len_best = uVar6;
    if (uVar6 == len_limit) {
      return matches;
    }
  } while( true );
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		const uint8_t *const pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = lzma_memcmplen(pb, cur, 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}